

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_point.cpp
# Opt level: O2

int metaNewIndex(lua_State *L)

{
  lua_Number lVar1;
  bool bVar2;
  uint32_t *puVar3;
  char *pcVar4;
  Variable *pVVar5;
  allocator local_59;
  Idx<Variable> var;
  string k;
  
  puVar3 = (uint32_t *)(*lua_touserdata)(L,1);
  var.Raw = *puVar3;
  var._4_4_ = puVar3[1];
  var._arena._0_4_ = puVar3[2];
  var._arena._4_4_ = puVar3[3];
  pcVar4 = (*lua_tolstring)(L,2,(size_t *)0x0);
  std::__cxx11::string::string((string *)&k,pcVar4,&local_59);
  bVar2 = std::operator==(&k,"name");
  if (bVar2) {
    (*lua_tolstring)(L,3,(size_t *)0x0);
    pVVar5 = Idx<Variable>::operator->(&var);
    std::__cxx11::string::assign((char *)&pVVar5->name);
  }
  else {
    bVar2 = std::operator==(&k,"value");
    if (bVar2) {
      (*lua_tolstring)(L,3,(size_t *)0x0);
      pVVar5 = Idx<Variable>::operator->(&var);
      std::__cxx11::string::assign((char *)&pVVar5->value);
    }
    else {
      bVar2 = std::operator==(&k,"valueType");
      if (bVar2) {
        lVar1 = lua_tonumber(L,3);
        pVVar5 = Idx<Variable>::operator->(&var);
        pVVar5->valueType = (int)lVar1;
      }
      else {
        bVar2 = std::operator==(&k,"valueTypeName");
        if (bVar2) {
          (*lua_tolstring)(L,3,(size_t *)0x0);
          pVVar5 = Idx<Variable>::operator->(&var);
          std::__cxx11::string::assign((char *)&pVVar5->valueTypeName);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&k);
  return 0;
}

Assistant:

int metaNewIndex(lua_State* L)
{
	auto* pVar = (Idx<Variable>*)lua_touserdata(L, 1);
	auto var = *pVar;
	const std::string k = lua_tostring(L, 2);
	if (k == "name")
	{
		const char* value = lua_tostring(L, 3);
		var->name = value ? value : "";
	}
	else if (k == "value")
	{
		const char* value = lua_tostring(L, 3);
		var->value = value ? value : "";
	}
	else if (k == "valueType")
	{
		var->valueType = static_cast<int>(lua_tonumber(L, 3));
	}
	else if (k == "valueTypeName")
	{
		const char* value = lua_tostring(L, 3);
		var->valueTypeName = value ? value : "";
	}
	return 0;
}